

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void runtime::printConstantArray<long>(ostream *out,vector<long,_std::allocator<long>_> *vec)

{
  bool bVar1;
  reference plVar2;
  ostream *poVar3;
  long *val;
  const_iterator __end0;
  const_iterator __begin0;
  vector<long,_std::allocator<long>_> *__range2;
  size_t i;
  vector<long,_std::allocator<long>_> *vec_local;
  ostream *out_local;
  
  __range2 = (vector<long,_std::allocator<long>_> *)0x0;
  __end0 = std::vector<long,_std::allocator<long>_>::begin(vec);
  val = (long *)std::vector<long,_std::allocator<long>_>::end(vec);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)&val);
    if (!bVar1) break;
    plVar2 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end0);
    poVar3 = std::operator<<(out,"| |");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)__range2);
    poVar3 = std::operator<<(poVar3,"| ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*plVar2);
    std::operator<<(poVar3,'\n');
    __range2 = (vector<long,_std::allocator<long>_> *)
               ((long)&(__range2->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&__end0);
  }
  return;
}

Assistant:

void printConstantArray(std::ostream & out, const std::vector<T> & vec) {
  std::size_t i = 0;
  for (const auto& val : vec) {
    out << "| |" << i << "| " << val << '\n';
    i++;
  }
}